

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void roll_hp(void)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  wchar_t max_value;
  wchar_t min_value;
  wchar_t j;
  wchar_t i;
  
  bVar1 = player->hitdie;
  bVar2 = player->hitdie;
  do {
    for (min_value = L'\x01'; min_value < L'2'; min_value = min_value + L'\x01') {
      uVar3 = Rand_div((uint)player->hitdie);
      player->player_hp[min_value] = player->player_hp[min_value + L'\xffffffff'] + (short)uVar3 + 1
      ;
    }
  } while (((int)player->player_hp[0x31] < (int)((bVar1 - 1) * 0x96) / 8 + 0x32) ||
          ((int)((bVar2 - 1) * 0xfa) / 8 + 0x32 < (int)player->player_hp[0x31]));
  return;
}

Assistant:

static void roll_hp(void)
{
	int i, j, min_value, max_value;

	/* Minimum hitpoints at highest level */
	min_value = (PY_MAX_LEVEL * (player->hitdie - 1) * 3) / 8;
	min_value += PY_MAX_LEVEL;

	/* Maximum hitpoints at highest level */
	max_value = (PY_MAX_LEVEL * (player->hitdie - 1) * 5) / 8;
	max_value += PY_MAX_LEVEL;

	/* Roll out the hitpoints */
	while (true) {
		/* Roll the hitpoint values */
		for (i = 1; i < PY_MAX_LEVEL; i++) {
			j = randint1(player->hitdie);
			player->player_hp[i] = player->player_hp[i-1] + j;
		}

		/* XXX Could also require acceptable "mid-level" hitpoints */

		/* Require "valid" hitpoints at highest level */
		if (player->player_hp[PY_MAX_LEVEL-1] < min_value) continue;
		if (player->player_hp[PY_MAX_LEVEL-1] > max_value) continue;

		/* Acceptable */
		break;
	}
}